

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall
QDateTimeEditPrivate::editorCursorPositionChanged(QDateTimeEditPrivate *this,int oldpos,int newpos)

{
  undefined1 *puVar1;
  QLineEdit *this_00;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int sectionIndex;
  uint uVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QAbstractSpinBoxPrivate).field_0x3d0 & 8) != 0) ||
     (bVar3 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate), bVar3))
  goto LAB_003c3ca5;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_58,this);
  updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,(QString *)&local_58);
  bVar3 = QLineEdit::hasSelectedText((this->super_QAbstractSpinBoxPrivate).edit);
  puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
  *puVar1 = *puVar1 | 8;
  iVar4 = sectionAt(this,newpos);
  if (iVar4 == -1) {
    if (newpos < 1 || newpos < oldpos) {
      iVar4 = -1;
    }
    else {
      iVar4 = sectionAt(this,newpos + -1);
    }
  }
  iVar5 = QLineEdit::selectionStart((this->super_QAbstractSpinBoxPrivate).edit);
  sectionIndex = sectionAt(this,iVar5);
  iVar8 = newpos;
  if (sectionIndex == -1) {
    if (iVar4 == -1) goto LAB_003c3b92;
LAB_003c3bfb:
    sectionIndex = iVar4;
    if (!bVar3 && *(int *)&this->field_0x3e0 != sectionIndex) {
      (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xd0))
                (this,0);
    }
  }
  else {
    iVar7 = (int)this + 0x3d8;
    uVar6 = QDateTimeParser::sectionSize(iVar7);
    if (iVar4 != -1) goto LAB_003c3bfb;
    if ((int)uVar6 < 1) {
LAB_003c3b92:
      sectionIndex = closestSection(this,newpos,oldpos <= newpos);
      iVar5 = (int)this + 0x3d8;
      iVar4 = QDateTimeParser::sectionPos(iVar5);
      iVar8 = 0;
      if (newpos < oldpos) {
        iVar5 = QDateTimeParser::sectionSize(iVar5);
        iVar8 = 0;
        if (0 < iVar5) {
          iVar8 = iVar5;
        }
      }
      iVar8 = iVar8 + iVar4;
      if (!bVar3) {
        QLineEdit::setCursorPosition((this->super_QAbstractSpinBoxPrivate).edit,iVar8);
        iVar4 = sectionIndex;
        goto LAB_003c3bfb;
      }
    }
    else {
      iVar4 = QDateTimeParser::sectionPos(iVar7);
      if (iVar5 != iVar4) goto LAB_003c3b92;
      QLineEdit::selectedText((QString *)&local_70,(this->super_QAbstractSpinBoxPrivate).edit);
      uVar2 = CONCAT44(local_70.size._4_4_,(int)local_70.size);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      if (uVar2 != uVar6) goto LAB_003c3b92;
      if (!bVar3) {
        setSelected(this,sectionIndex,true);
        iVar8 = -1;
        iVar4 = sectionIndex;
        goto LAB_003c3bfb;
      }
      iVar8 = -1;
    }
  }
  if (iVar8 == -1) {
    setSelected(this,sectionIndex,true);
  }
  else {
    bVar3 = QLineEdit::hasSelectedText((this->super_QAbstractSpinBoxPrivate).edit);
    if (!bVar3) {
      this_00 = (this->super_QAbstractSpinBoxPrivate).edit;
      if (oldpos < newpos) {
        (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
                  (&local_70,this);
        QLineEdit::setCursorPosition(this_00,(iVar8 + (int)local_70.size) - (int)local_58.size);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
      else {
        QLineEdit::setCursorPosition(this_00,iVar8);
      }
    }
  }
  *(int *)&this->field_0x3e0 = sectionIndex;
  puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
  *puVar1 = *puVar1 & 0xf7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_003c3ca5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::editorCursorPositionChanged(int oldpos, int newpos)
{
    if (ignoreCursorPositionChanged || specialValue())
        return;
    const QString oldText = displayText();
    updateCache(value, oldText);

    const bool allowChange = !edit->hasSelectedText();
    const bool forward = oldpos <= newpos;
    ignoreCursorPositionChanged = true;
    int s = sectionAt(newpos);
    if (s == NoSectionIndex && forward && newpos > 0) {
        s = sectionAt(newpos - 1);
    }

    int c = newpos;

    const int selstart = edit->selectionStart();
    const int selSection = sectionAt(selstart);
    const int l = selSection != -1 ? sectionSize(selSection) : 0;

    if (s == NoSectionIndex) {
        if (l > 0 && selstart == sectionPos(selSection) && edit->selectedText().size() == l) {
            s = selSection;
            if (allowChange)
                setSelected(selSection, true);
            c = -1;
        } else {
            int closest = closestSection(newpos, forward);
            c = sectionPos(closest) + (forward ? 0 : qMax<int>(0, sectionSize(closest)));

            if (allowChange) {
                edit->setCursorPosition(c);
                QDTEDEBUG << c;
            }
            s = closest;
        }
    }

    if (allowChange && currentSectionIndex != s) {
        interpret(EmitIfChanged);
    }
    if (c == -1) {
        setSelected(s, true);
    } else if (!edit->hasSelectedText()) {
        if (oldpos < newpos) {
            edit->setCursorPosition(displayText().size() - (oldText.size() - c));
        } else {
            edit->setCursorPosition(c);
        }
    }

    QDTEDEBUG << "currentSectionIndex is set to" << sectionNode(s).name()
              << oldpos << newpos
              << "was" << sectionNode(currentSectionIndex).name();

    currentSectionIndex = s;
    Q_ASSERT_X(currentSectionIndex < sectionNodes.size(),
               "QDateTimeEditPrivate::editorCursorPositionChanged()",
               qPrintable(QString::fromLatin1("Internal error (%1 %2)").
                          arg(currentSectionIndex).
                          arg(sectionNodes.size())));

    ignoreCursorPositionChanged = false;
}